

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.hpp
# Opt level: O2

void __thiscall duckdb::QueryGraphManager::~QueryGraphManager(QueryGraphManager *this)

{
  QueryGraphEdges::QueryEdge::~QueryEdge(&(this->query_graph).root);
  ::std::
  vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ::~vector(&(this->filters_and_bindings).
             super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
           );
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                   *)&this->filter_operators);
  JoinRelationSetManager::JoinRelationTreeNode::~JoinRelationTreeNode(&(this->set_manager).root);
  RelationManager::~RelationManager(&this->relation_manager);
  return;
}

Assistant:

explicit QueryGraphManager(ClientContext &context) : relation_manager(context), context(context) {
	}